

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void anon_unknown.dwarf_8df1c::ReportAt
               (ExpressionContext *ctx,SynBase *source,char *pos,char *msg,__va_list_tag *args)

{
  SynBase *pSVar1;
  char *pcVar2;
  size_t sVar3;
  ErrorInfo *this;
  ModuleData *pMVar4;
  ErrorInfo **ppEVar5;
  ModuleData *parentModule;
  char *code;
  Lexeme *local_40;
  char *messageEnd;
  char *messageStart;
  __va_list_tag *args_local;
  char *msg_local;
  char *pos_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  messageStart = (char *)args;
  args_local = (__va_list_tag *)msg;
  msg_local = pos;
  pos_local = (char *)source;
  source_local = (SynBase *)ctx;
  if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = pos;
      ctx->errorBufLocation = ctx->errorBuf;
    }
    messageEnd = ctx->errorBufLocation;
    vsnprintf(ctx->errorBufLocation,
              (ulong)(ctx->errorBufSize - ((int)ctx->errorBufLocation - (int)ctx->errorBuf)),msg,
              args);
    *(undefined1 *)
     (*(long *)&source_local[0x21b].typeID + (ulong)(*(int *)&source_local[0x21b].begin - 1)) = 0;
    pcVar2 = strstr((char *)source_local[0x21b].end,"%error-type%");
    if (pcVar2 != (char *)0x0) {
      __assert_fail("strstr(ctx.errorBufLocation, \"%error-type%\") == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x48,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
    sVar3 = strlen((char *)source_local[0x21b].end);
    source_local[0x21b].end = (Lexeme *)((long)&(source_local[0x21b].end)->type + sVar3);
    local_40 = source_local[0x21b].end;
    pSVar1 = source_local + 0x21b;
    this = ExpressionContext::get<ErrorInfo>((ExpressionContext *)source_local);
    ErrorInfo::ErrorInfo
              (this,(Allocator *)source_local[0x229].begin,messageEnd,(char *)local_40,
               *(Lexeme **)(pos_local + 0x10),*(Lexeme **)(pos_local + 0x18),msg_local);
    code = (char *)this;
    SmallArray<ErrorInfo_*,_4U>::push_back
              ((SmallArray<ErrorInfo_*,_4U> *)&pSVar1->pos,(ErrorInfo **)&code);
    pcVar2 = FindModuleCodeWithSourceLocation((ExpressionContext *)source_local,msg_local);
    if (pcVar2 != (char *)0x0) {
      AddErrorLocationInfo
                (pcVar2,msg_local,(char *)source_local[0x21b].end,
                 *(int *)&source_local[0x21b].begin -
                 ((int)source_local[0x21b].end - (int)*(undefined8 *)&source_local[0x21b].typeID));
      sVar3 = strlen((char *)source_local[0x21b].end);
      source_local[0x21b].end = (Lexeme *)((long)&(source_local[0x21b].end)->type + sVar3);
      if ((pcVar2 != *(char **)&source_local->typeID) &&
         (pMVar4 = FindModuleWithSourceLocation
                             ((ExpressionContext *)source_local,*(char **)(pos_local + 0x20)),
         pMVar4 != (ModuleData *)0x0)) {
        NULLC::SafeSprintf((char *)source_local[0x21b].end,
                           (ulong)(uint)(*(int *)&source_local[0x21b].begin -
                                        ((int)source_local[0x21b].end -
                                        (int)*(undefined8 *)&source_local[0x21b].typeID)),
                           " [in module \'%.*s\']\n",
                           (ulong)(uint)((int)(pMVar4->name).end - (int)(pMVar4->name).begin),
                           (pMVar4->name).begin);
        sVar3 = strlen((char *)source_local[0x21b].end);
        source_local[0x21b].end = (Lexeme *)((long)&(source_local[0x21b].end)->type + sVar3);
        ppEVar5 = SmallArray<ErrorInfo_*,_4U>::back
                            ((SmallArray<ErrorInfo_*,_4U> *)&source_local[0x21b].pos);
        (*ppEVar5)->parentModule = pMVar4;
      }
    }
  }
  if (((ulong)source_local[0x217].pos.end & 0x100) != 0) {
    if (((ulong)source_local[0x217].pos.end & 1) == 0) {
      __assert_fail("ctx.errorHandlerActive",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x68,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
    longjmp((__jmp_buf_tag *)&source_local[0x217].next,1);
  }
  *(int *)&source_local[0x21b]._vptr_SynBase = *(int *)&source_local[0x21b]._vptr_SynBase + 1;
  if (*(int *)&source_local[0x21b]._vptr_SynBase == 100) {
    NULLC::SafeSprintf((char *)source_local[0x21b].end,
                       (ulong)(uint)(*(int *)&source_local[0x21b].begin -
                                    ((int)source_local[0x21b].end -
                                    (int)*(undefined8 *)&source_local[0x21b].typeID)),
                       "ERROR: error limit reached");
    sVar3 = strlen((char *)source_local[0x21b].end);
    source_local[0x21b].end = (Lexeme *)((long)&(source_local[0x21b].end)->type + sVar3);
    if (((ulong)source_local[0x217].pos.end & 1) == 0) {
      __assert_fail("ctx.errorHandlerActive",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x75,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
    longjmp((__jmp_buf_tag *)&source_local[0x217].next,1);
  }
  return;
}

Assistant:

void ReportAt(ExpressionContext &ctx, SynBase *source, const char *pos, const char *msg, va_list args)
	{
		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = pos;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			const char *messageStart = ctx.errorBufLocation;

			vsnprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), msg, args);
			ctx.errorBuf[ctx.errorBufSize - 1] = '\0';

			// Shouldn't report errors that are caused by error recovery
			assert(strstr(ctx.errorBufLocation, "%error-type%") == NULL);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			const char *messageEnd = ctx.errorBufLocation;

			ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, pos));

			if(const char *code = FindModuleCodeWithSourceLocation(ctx, pos))
			{
				AddErrorLocationInfo(code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				if(code != ctx.code)
				{
					ModuleData *parentModule = FindModuleWithSourceLocation(ctx, source->pos.begin);

					if(parentModule)
					{
						NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), " [in module '%.*s']\n", FMT_ISTR(parentModule->name));

						ctx.errorBufLocation += strlen(ctx.errorBufLocation);

						ctx.errorInfo.back()->parentModule = parentModule;
					}
				}
			}
		}

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		if(ctx.errorCount == 100)
		{
			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: error limit reached");

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}